

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O3

Expression * __thiscall
wasm::TranslateToFuzzReader::makeArraySet(TranslateToFuzzReader *this,Type type)

{
  undefined1 type_00 [8];
  uint32_t uVar1;
  value_type *pvVar2;
  Expression *pEVar3;
  Expression *ref;
  Expression *pEVar4;
  undefined1 *puVar5;
  Expression *pEVar6;
  undefined1 local_60 [8];
  BoundsCheck check;
  value_type arrayType;
  
  if (type.id != 0) {
    __assert_fail("type == Type::none",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                  ,0x13bf,"Expression *wasm::TranslateToFuzzReader::makeArraySet(Type)");
  }
  if ((this->mutableArrays).super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      (this->mutableArrays).super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    pvVar2 = Random::pick<std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>
                       (&this->random,&this->mutableArrays);
    check.getLength = (Expression *)pvVar2->id;
    wasm::HeapType::getArray();
    type_00 = local_60;
    pEVar3 = make(this,(Type)0x2);
    ref = makeTrappingRefUse(this,(HeapType)check.getLength);
    pEVar4 = make(this,(Type)type_00);
    if ((this->allowOOB == true) && (uVar1 = Random::upTo(&this->random,10), uVar1 == 0)) {
      pEVar6 = (Expression *)MixedArena::allocSpace(&((this->builder).wasm)->allocator,0x28,8);
      pEVar6->_id = ArraySetId;
      (pEVar6->type).id = 0;
      *(Expression **)(pEVar6 + 1) = ref;
      pEVar6[1].type.id = (uintptr_t)pEVar3;
      *(Expression **)(pEVar6 + 2) = pEVar4;
      wasm::ArraySet::finalize();
      return pEVar6;
    }
    makeArrayBoundsCheck
              ((BoundsCheck *)local_60,ref,pEVar3,this->funcContext->func,&this->builder,
               (Expression *)0x0);
    puVar5 = (undefined1 *)MixedArena::allocSpace(&((this->builder).wasm)->allocator,0x28,8);
    *puVar5 = 0x4b;
    *(undefined8 *)(puVar5 + 8) = 0;
    *(Expression **)(puVar5 + 0x10) = check.condition;
    *(Expression **)(puVar5 + 0x18) = check.getRef;
    *(Expression **)(puVar5 + 0x20) = pEVar4;
    wasm::ArraySet::finalize();
    pEVar3 = (Expression *)MixedArena::allocSpace(&((this->builder).wasm)->allocator,0x28,8);
    pEVar3->_id = IfId;
    (pEVar3->type).id = 0;
    pEVar3[1]._id = local_60;
    pEVar3[1].type.id = (uintptr_t)puVar5;
    *(undefined8 *)(pEVar3 + 2) = 0;
    wasm::If::finalize(pEVar3);
    return pEVar3;
  }
  pEVar3 = makeTrivial(this,(Type)0x0);
  return pEVar3;
}

Assistant:

Expression* TranslateToFuzzReader::makeArraySet(Type type) {
  assert(type == Type::none);
  if (mutableArrays.empty()) {
    return makeTrivial(type);
  }
  auto arrayType = pick(mutableArrays);
  auto elementType = arrayType.getArray().element.type;
  auto* index = make(Type::i32);
  auto* ref = makeTrappingRefUse(arrayType);
  auto* value = make(elementType);
  // Only rarely emit a plain get which might trap. See related logic in
  // ::makePointer().
  if (allowOOB && oneIn(10)) {
    return builder.makeArraySet(ref, index, value);
  }
  // To avoid a trap, check the length dynamically using this pattern:
  //
  //   if (index < array.len) array[index] = value;
  //
  auto check = makeArrayBoundsCheck(ref, index, funcContext->func, builder);
  auto* set = builder.makeArraySet(check.getRef, check.getIndex, value);
  return builder.makeIf(check.condition, set);
}